

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O2

void __thiscall duckdb::RleBpEncoder::WriteCurrentBlockBP(RleBpEncoder *this,WriteStream *writer)

{
  ParquetDecodeUtils::VarintEncode<unsigned_long>(0x41,writer);
  BitpackingPrimitives::PackBuffer<unsigned_int,true>
            ((data_ptr_t)this->bp_block_packed,this->bp_block,0x100,
             (bitpacking_width_t)this->bit_width);
  (**writer->_vptr_WriteStream)(writer,this->bp_block_packed,(ulong)this->bit_width << 5);
  this->bp_block_count = 0;
  return;
}

Assistant:

void WriteCurrentBlockBP(WriteStream &writer) {
		ParquetDecodeUtils::VarintEncode(BP_BLOCK_SIZE / 8 << 1 | 1, writer); // (... | 1) signals BP run
		ParquetDecodeUtils::BitPackAligned(bp_block, data_ptr_cast(bp_block_packed), BP_BLOCK_SIZE, bit_width);
		writer.WriteData(data_ptr_cast(bp_block_packed), BP_BLOCK_SIZE * bit_width / 8);
		bp_block_count = 0;
	}